

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void dfg_stone_close_handler(CManager cm,CMConnection conn,int stone,void *client_data)

{
  _event_path_data *p_Var1;
  lookup_table_elem *plVar2;
  FILE *pFVar3;
  int iVar4;
  __pid_t _Var5;
  CMFormat format;
  pthread_t pVar6;
  long lVar7;
  long lVar8;
  EVconn_shutdown_msg msg;
  timespec local_38;
  
  p_Var1 = cm->evp;
  format = INT_CMlookup_format(*client_data,EVdfg_conn_shutdown_format_list);
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x47c);
  INT_EVfreeze_stone(cm,stone);
  lVar7 = (long)p_Var1->stone_lookup_table_size;
  if (lVar7 < 1) {
    iVar4 = -1;
  }
  else {
    plVar2 = p_Var1->stone_lookup_table;
    iVar4 = -1;
    lVar8 = 0;
    do {
      if (plVar2[lVar8].local_id == stone) {
        iVar4 = plVar2[lVar8].global_id;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if (iVar4 == -1) {
    iVar4 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                CONCAT44(local_38.tv_sec._4_4_,(int)local_38.tv_sec),local_38.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "Bad mojo, failed to find global stone id after stone close of stone %d\n",
              (ulong)(uint)stone);
    }
    fflush((FILE *)cm->CMTrace_file);
    iVar4 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",
                CONCAT44(local_38.tv_sec._4_4_,(int)local_38.tv_sec),local_38.tv_nsec);
      }
      fwrite("  If the above message occurs during shutdown, this is likely not a concern\n",0x4c,1,
             (FILE *)cm->CMTrace_file);
    }
    fflush((FILE *)cm->CMTrace_file);
    iVar4 = 0x489;
  }
  else {
    local_38.tv_sec._0_4_ = iVar4;
    if (*(CMConnection *)((long)client_data + 0x20) == (CMConnection)0x0) {
      queue_master_msg(*(EVmaster *)((long)client_data + 0x28),&local_38,DFGconn_shutdown,
                       (CMConnection)0x0,0);
    }
    else {
      INT_CMwrite(*(CMConnection *)((long)client_data + 0x20),format,&local_38);
    }
    cm = *client_data;
    iVar4 = 0x492;
  }
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,iVar4);
  return;
}

Assistant:

static void
dfg_stone_close_handler(CManager cm, CMConnection conn, int stone, 
		  void *client_data)
{
    EVclient client = (EVclient)client_data;
    event_path_data evp = cm->evp;
    int global_stone_id = -1;
    CMFormat conn_shutdown_msg = INT_CMlookup_format(client->cm, EVdfg_conn_shutdown_format_list);
    EVconn_shutdown_msg msg;
    (void)cm;
    (void)conn;
    CManager_lock(cm);
    /* first, freeze the stone so that we don't lose any more data */
    INT_EVfreeze_stone(cm, stone);

    int i;
    for (i=0; i < evp->stone_lookup_table_size; i++ ) {
	if (stone == evp->stone_lookup_table[i].local_id) {
	    global_stone_id = evp->stone_lookup_table[i].global_id;
	}
    }
    if (global_stone_id == -1) {
	CMtrace_out(cm, EVdfgVerbose, "Bad mojo, failed to find global stone id after stone close of stone %d\n", stone);
	CMtrace_out(cm, EVdfgVerbose, "  If the above message occurs during shutdown, this is likely not a concern\n");
	CManager_unlock(cm);
	return;
    }
    msg.stone = global_stone_id;
    if (client->master_connection != NULL) {
	INT_CMwrite(client->master_connection, conn_shutdown_msg, &msg);
    } else {
	queue_master_msg(client->master, (void*)&msg, DFGconn_shutdown, NULL, /*copy*/0);
    }
    CManager_unlock(client->cm);
}